

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLCellLinOp::interpolation
          (MLCellLinOp *this,int amrlev,int fmglev,MultiFab *fine,MultiFab *crse)

{
  pointer pIVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  bool bVar23;
  MFIter mfi;
  ulong local_1d0;
  double *local_1c8;
  long local_198;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  double *pdVar16;
  
  uVar3 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  iVar11 = 2;
  iVar12 = 2;
  iVar22 = 2;
  if (amrlev < 1) {
    pIVar1 = (this->super_MLLinOp).mg_coarsen_ratio_vec.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar22 = pIVar1[fmglev].vect[0];
    iVar12 = pIVar1[fmglev].vect[1];
    iVar11 = pIVar1[fmglev].vect[2];
  }
  MFIter::MFIter(&local_90,(FabArrayBase *)fine,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_12c,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,&crse->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,&fine->super_FabArray<amrex::FArrayBox>,&local_90);
      if (0 < (int)uVar3) {
        uVar10 = (ulong)local_12c.smallend.vect[0];
        local_198 = 0;
        local_1d0 = 0;
        do {
          uVar7 = local_12c.smallend.vect[2];
          if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
            do {
              if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                uVar13 = uVar7 + 1;
                uVar17 = -uVar13;
                if (0 < (int)uVar13) {
                  uVar17 = uVar13;
                }
                uVar13 = ~(uVar17 >> 2);
                if (-1 < (int)uVar7) {
                  uVar13 = uVar7 >> 2;
                }
                uVar18 = ~(uVar17 >> 1);
                if (-1 < (int)uVar7) {
                  uVar18 = uVar7 >> 1;
                }
                local_1c8 = (double *)
                            ((long)local_110.p +
                            local_110.nstride * local_198 +
                            ((long)local_12c.smallend.vect[1] - (long)local_110.begin.y) *
                            local_110.jstride * 8 +
                            ((long)(int)uVar7 - (long)local_110.begin.z) * local_110.kstride * 8 +
                            (long)local_110.begin.x * -8 + uVar10 * 8);
                uVar19 = (long)local_12c.smallend.vect[1];
                do {
                  if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                    uVar2 = (uint)uVar19;
                    uVar8 = uVar2 + 1;
                    uVar14 = -uVar8;
                    if (0 < (int)uVar8) {
                      uVar14 = uVar8;
                    }
                    pdVar16 = local_1c8;
                    uVar20 = uVar10;
                    uVar8 = ~(uVar14 >> 2);
                    uVar15 = ~(uVar14 >> 1);
                    if (-1 < (long)uVar19) {
                      uVar8 = (uint)(uVar19 >> 2) & 0x3fffffff;
                      uVar15 = (uint)(uVar19 >> 1) & 0x7fffffff;
                    }
                    do {
                      uVar5 = (uint)uVar20;
                      if (iVar22 == 4) {
                        if ((long)uVar20 < 0) {
                          uVar5 = uVar5 + 1;
                          uVar21 = -uVar5;
                          if (0 < (int)uVar5) {
                            uVar21 = uVar5;
                          }
                          uVar5 = uVar21 >> 2;
LAB_00576d3a:
                          uVar5 = ~uVar5;
                        }
                        else {
                          uVar5 = (uint)(uVar20 >> 2) & 0x3fffffff;
                        }
                      }
                      else if (iVar22 == 2) {
                        if ((long)uVar20 < 0) {
                          uVar5 = uVar5 + 1;
                          uVar21 = -uVar5;
                          if (0 < (int)uVar5) {
                            uVar21 = uVar5;
                          }
                          uVar5 = uVar21 >> 1;
                          goto LAB_00576d3a;
                        }
                        uVar5 = (uint)(uVar20 >> 1) & 0x7fffffff;
                      }
                      else if (iVar22 != 1) {
                        if ((long)uVar20 < 0) {
                          iVar9 = uVar5 + 1;
                          iVar4 = -iVar9;
                          if (0 < iVar9) {
                            iVar4 = iVar9;
                          }
                          uVar5 = iVar4 / iVar22;
                          goto LAB_00576d3a;
                        }
                        uVar5 = (uint)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 |
                                             uVar20 & 0xffffffff) / (long)iVar22);
                      }
                      uVar21 = uVar2;
                      if (((iVar12 != 1) && (uVar21 = uVar8, iVar12 != 4)) &&
                         (uVar21 = uVar15, iVar12 != 2)) {
                        if ((long)uVar19 < 0) {
                          uVar21 = ~((int)uVar14 / iVar12);
                        }
                        else {
                          uVar21 = (uint)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 |
                                                uVar19 & 0xffffffff) / (long)iVar12);
                        }
                      }
                      uVar6 = uVar7;
                      if (((iVar11 != 1) && (uVar6 = uVar13, iVar11 != 4)) &&
                         (uVar6 = uVar18, iVar11 != 2)) {
                        if ((int)uVar7 < 0) {
                          uVar6 = ~((int)uVar17 / iVar11);
                        }
                        else {
                          uVar6 = (int)uVar7 / iVar11;
                        }
                      }
                      *pdVar16 = local_d0.p
                                 [((long)(int)uVar21 - (long)local_d0.begin.y) * local_d0.jstride +
                                  ((long)(int)uVar5 - (long)local_d0.begin.x) +
                                  ((long)(int)uVar6 - (long)local_d0.begin.z) * local_d0.kstride +
                                  local_d0.nstride * local_1d0] + *pdVar16;
                      uVar20 = uVar20 + 1;
                      pdVar16 = pdVar16 + 1;
                    } while (local_12c.bigend.vect[0] + 1 != (int)uVar20);
                  }
                  uVar19 = uVar19 + 1;
                  local_1c8 = local_1c8 + local_110.jstride;
                } while (local_12c.bigend.vect[1] + 1 != (int)uVar19);
              }
              bVar23 = uVar7 != local_12c.bigend.vect[2];
              uVar7 = uVar7 + 1;
            } while (bVar23);
          }
          local_1d0 = local_1d0 + 1;
          local_198 = local_198 + 8;
        } while (local_1d0 != uVar3);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLCellLinOp::interpolation (int amrlev, int fmglev, MultiFab& fine, const MultiFab& crse) const
{
#ifdef AMREX_SOFT_PERF_COUNTERS
    perf_counters.interpolate(fine);
#endif

    const int ncomp = getNComp();

    Dim3 ratio3 = {2,2,2};
    IntVect ratio = (amrlev > 0) ? IntVect(2) : mg_coarsen_ratio_vec[fmglev];
    AMREX_D_TERM(ratio3.x = ratio[0];,
                 ratio3.y = ratio[1];,
                 ratio3.z = ratio[2];);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && fine.isFusingCandidate()) {
        auto const& finema = fine.arrays();
        auto const& crsema = crse.const_arrays();
        ParallelFor(fine, IntVect(0), ncomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            int ic = amrex::coarsen(i,ratio3.x);
            int jc = amrex::coarsen(j,ratio3.y);
            int kc = amrex::coarsen(k,ratio3.z);
            finema[box_no](i,j,k,n) += crsema[box_no](ic,jc,kc,n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx    = mfi.tilebox();
            Array4<Real const> const& cfab = crse.const_array(mfi);
            Array4<Real> const& ffab = fine.array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                int ic = amrex::coarsen(i,ratio3.x);
                int jc = amrex::coarsen(j,ratio3.y);
                int kc = amrex::coarsen(k,ratio3.z);
                ffab(i,j,k,n) += cfab(ic,jc,kc,n);
            });
        }
    }
}